

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

void __thiscall
polyscope::CurveNetwork::fillNodeGeometryBuffers(CurveNetwork *this,ShaderProgram *program)

{
  bool bVar1;
  allocator local_71;
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"a_position",&local_71);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(local_70 + 0x10));
  (*program->_vptr_ShaderProgram[0x13])(program,local_30,local_70 + 0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__cxx11::string::~string(local_30);
  bVar1 = std::operator!=(&this->nodeRadiusQuantityName,"");
  if (bVar1) {
    resolveNodeRadiusQuantity(this);
    std::__cxx11::string::string(local_50,"a_pointRadius",&local_71);
    render::ManagedBuffer<float>::getRenderAttributeBuffer((ManagedBuffer<float> *)local_70);
    (*program->_vptr_ShaderProgram[0x13])(program,local_50,local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void CurveNetwork::fillNodeGeometryBuffers(render::ShaderProgram& program) {
  program.setAttribute("a_position", nodePositions.getRenderAttributeBuffer());

  if (nodeRadiusQuantityName != "") {
    CurveNetworkNodeScalarQuantity& nodeRadQ = resolveNodeRadiusQuantity();
    program.setAttribute("a_pointRadius", nodeRadQ.values.getRenderAttributeBuffer());
  }
}